

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O3

adjusted_mantissa fast_float::positive_digit_comp<double>(bigint *bigmant,int32_t exponent)

{
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  adjusted_mantissa aVar11;
  bool truncated;
  bool local_19;
  
  bVar1 = bigint::pow5(bigmant,exponent);
  if (bVar1) {
    bigint::shl(bigmant,(ulong)(uint)exponent);
  }
  uVar3 = bigint::hi64(bigmant,&local_19);
  iVar2 = bigint::ctlz(bigmant);
  uVar8 = (uint)(bigmant->vec).length * 0x40 - iVar2;
  if ((int)uVar8 < -0x3fd) {
    uVar10 = 0;
    if (-uVar8 - 0x3f2 < 0x40) {
      uVar10 = -uVar8 - 0x3f2;
    }
    bVar5 = (byte)uVar10;
    uVar6 = 0;
    if (0xfffffbce < uVar8) {
      uVar6 = uVar3 >> (bVar5 & 0x3f);
    }
    uVar7 = ~(-1L << (bVar5 & 0x3f));
    if (0xfffffbce >= uVar8) {
      uVar7 = 0xffffffffffffffff;
    }
    uVar7 = uVar7 & uVar3;
    uVar4 = 1;
    uVar9 = 1L << (bVar5 - 1 & 0x3f);
    if ((uVar7 <= uVar9) && ((uVar7 != uVar9 || (local_19 == false)))) {
      uVar4 = (ulong)(uVar7 == uVar9 & (byte)uVar6);
    }
    uVar7 = (ulong)(uVar4 + uVar6 >> 0x34 != 0);
    uVar6 = uVar4 + uVar6;
  }
  else {
    uVar10 = (uint)uVar3 & 0x7ff;
    uVar6 = 1;
    if ((uVar10 < 0x401) && ((uVar10 != 0x400 || (local_19 == false)))) {
      uVar6 = (ulong)(((uint)uVar3 & 0xfff) == 0xc00);
    }
    uVar6 = uVar6 + (uVar3 >> 0xb);
    bVar1 = uVar6 >> 0x35 == 0;
    uVar8 = (bVar1 ^ 0x3ff) + uVar8;
    uVar6 = uVar6 & 0x2fffffffffffff;
    if (!bVar1) {
      uVar6 = 0;
    }
    uVar10 = uVar8;
    if (0x7fe < uVar8) {
      uVar10 = 0x7ff;
    }
    uVar7 = (ulong)uVar10;
    if (0x7fe < uVar8) {
      uVar6 = 0;
    }
  }
  aVar11._8_8_ = uVar7;
  aVar11.mantissa = uVar6;
  return aVar11;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
adjusted_mantissa positive_digit_comp(bigint& bigmant, int32_t exponent) noexcept {
  FASTFLOAT_ASSERT(bigmant.pow10(uint32_t(exponent)));
  adjusted_mantissa answer;
  bool truncated;
  answer.mantissa = bigmant.hi64(truncated);
  int bias = binary_format<T>::mantissa_explicit_bits() - binary_format<T>::minimum_exponent();
  answer.power2 = bigmant.bit_length() - 64 + bias;

  round<T>(answer, [truncated](adjusted_mantissa& a, int32_t shift) {
    round_nearest_tie_even(a, shift, [truncated](bool is_odd, bool is_halfway, bool is_above) -> bool {
      return is_above || (is_halfway && truncated) || (is_odd && is_halfway);
    });
  });

  return answer;
}